

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile,string *objPath)

{
  cmGeneratedFileStream *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  string sourceFileName;
  string buildFileDir;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar4);
  pcVar1 = (this->CompileCommandsStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 == (cmGeneratedFileStream *)0x0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[23]>
              (&local_c0,&local_60,(char (*) [23])"/compile_commands.json");
    if (this->ComputingUnknownDependencies == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"compile_commands.json",(allocator<char> *)&local_80);
      NinjaOutputPath(&local_e0,this,&local_a0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedBuildOutputs,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>(&local_e0);
    _Var2._M_p = local_e0._M_dataplus._M_p;
    local_e0._M_dataplus._M_p = (pointer)0x0;
    pcVar1 = (this->CompileCommandsStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CompileCommandsStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)_Var2._M_p;
    if (pcVar1 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar1->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      if ((cmGeneratedFileStream *)local_e0._M_dataplus._M_p != (cmGeneratedFileStream *)0x0) {
        (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
      }
    }
    std::operator<<((ostream *)
                    (this->CompileCommandsStream)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"[\n");
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    std::operator<<((ostream *)pcVar1,",\n");
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)sourceFile);
  bVar3 = cmsys::SystemTools::FileIsFullPath(&local_c0);
  if (!bVar3) {
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmsys::SystemTools::CollapseFullPath(&local_e0,&local_c0,psVar4);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  poVar5 = std::operator<<((ostream *)
                           (this->CompileCommandsStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"{\n"
                          );
  poVar5 = std::operator<<(poVar5,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_e0,&local_60);
  poVar5 = std::operator<<(poVar5,(string *)&local_e0);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_a0,commandLine);
  poVar5 = std::operator<<(poVar5,(string *)&local_a0);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_80,&local_c0);
  poVar5 = std::operator<<(poVar5,(string *)&local_80);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"output\": \"");
  cmGlobalGenerator::EscapeJSON(&local_40,objPath);
  poVar5 = std::operator<<(poVar5,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,"\"\n");
  std::operator<<(poVar5,"}");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile,
  const std::string& objPath)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath =
      cmStrCat(buildFileDir, "/compile_commands.json");
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      cm::make_unique<cmGeneratedFileStream>(buildFilePath);
    *this->CompileCommandsStream << "[\n";
  } else {
    *this->CompileCommandsStream << ",\n";
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "{\n"
     << R"(  "directory": ")"
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << R"(  "command": ")"
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << R"(  "file": ")"
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\",\n"
     << R"(  "output": ")"
     << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n"
     << "}";
  /* clang-format on */
}